

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qAverageColor.cpp
# Opt level: O2

uint32_t AverageColorRGBA8(uint32_t *Pixels,size_t Count)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t i;
  size_t sVar6;
  
  uVar4 = 0;
  uVar5 = 0;
  uVar3 = 0;
  uVar2 = 0;
  for (sVar6 = 0; Count != sVar6; sVar6 = sVar6 + 1) {
    uVar1 = Pixels[sVar6];
    uVar3 = uVar3 + (uVar1 >> 0x18);
    uVar5 = uVar5 + (uVar1 >> 0x10 & 0xff);
    uVar4 = uVar4 + (uVar1 >> 8 & 0xff);
    uVar2 = uVar2 + (uVar1 & 0xff);
  }
  return (int)(uVar3 / Count) << 0x18 | ((uint)(uVar5 / Count) & 0xff) << 0x10 |
         ((uint)(uVar4 / Count) & 0xff) << 8 | (uint)(uVar2 / Count) & 0xff;
}

Assistant:

std::uint32_t AverageColorRGBA8(
	const std::uint32_t Pixels[],
	std::size_t Count
)
{
	std::uint64_t RedSum, GreenSum, BlueSum, AlphaSum;
	RedSum = GreenSum = BlueSum = AlphaSum = 0;
	for( std::size_t i = 0; i < Count; ++i )
	{
		const std::uint32_t& CurColor = Pixels[i];
		AlphaSum += static_cast<std::uint8_t>( CurColor >> 24 );
		BlueSum  += static_cast<std::uint8_t>( CurColor >> 16 );
		GreenSum += static_cast<std::uint8_t>( CurColor >>  8 );
		RedSum   += static_cast<std::uint8_t>( CurColor >>  0 );
	}
	RedSum   /= Count;
	GreenSum /= Count;
	BlueSum  /= Count;
	AlphaSum /= Count;

	return
		(static_cast<std::uint32_t>( (std::uint8_t)AlphaSum ) << 24 ) |
		(static_cast<std::uint32_t>( (std::uint8_t) BlueSum ) << 16 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)GreenSum ) <<  8 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)  RedSum ) <<  0 );
}